

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_omac_acpkm.c
# Opt level: O3

void CMAC_ACPKM_CTX_free(CMAC_ACPKM_CTX *ctx)

{
  if (ctx != (CMAC_ACPKM_CTX *)0x0) {
    EVP_CIPHER_CTX_reset(ctx->cctx);
    EVP_CIPHER_CTX_reset(ctx->actx);
    OPENSSL_cleanse(ctx->tbl,0x20);
    OPENSSL_cleanse(ctx->km,0x30);
    OPENSSL_cleanse(ctx->last_block,0x20);
    ctx->nlast_block = -1;
    EVP_CIPHER_CTX_free((EVP_CIPHER_CTX *)ctx->cctx);
    EVP_CIPHER_CTX_free((EVP_CIPHER_CTX *)ctx->actx);
    CRYPTO_free(ctx);
    return;
  }
  return;
}

Assistant:

static void CMAC_ACPKM_CTX_free(CMAC_ACPKM_CTX *ctx)
{
    if (!ctx)
        return;
    CMAC_ACPKM_CTX_cleanup(ctx);
    EVP_CIPHER_CTX_free(ctx->cctx);
    EVP_CIPHER_CTX_free(ctx->actx);
    OPENSSL_free(ctx);
}